

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

bool __thiscall Func::DoGlobOpt(Func *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  BOOL BVar4;
  Func *pFVar5;
  JITTimeFunctionBody *this_00;
  byte local_21;
  byte local_11;
  Func *this_local;
  
  uVar2 = GetSourceContextId(this);
  uVar3 = GetLocalFunctionId(this);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,GlobOptPhase,uVar2,uVar3);
  local_11 = 0;
  if (!bVar1) {
    bVar1 = IsSimpleJit(this);
    local_11 = 0;
    if (!bVar1) {
      pFVar5 = GetTopFunc(this);
      BVar4 = HasTry(pFVar5);
      if (BVar4 != 0) {
        pFVar5 = GetTopFunc(this);
        bVar1 = CanOptimizeTryCatch(pFVar5);
        local_11 = 0;
        if (!bVar1) goto LAB_004e904d;
      }
      pFVar5 = GetTopFunc(this);
      bVar1 = HasFinally(pFVar5);
      if (bVar1) {
        pFVar5 = GetTopFunc(this);
        bVar1 = CanOptimizeTryFinally(pFVar5);
        local_11 = 0;
        if (!bVar1) goto LAB_004e904d;
      }
      pFVar5 = GetTopFunc(this);
      this_00 = GetJITFunctionBody(pFVar5);
      bVar1 = JITTimeFunctionBody::IsCoroutine(this_00);
      local_21 = 1;
      if (bVar1) {
        uVar2 = GetSourceContextId(this);
        uVar3 = GetLocalFunctionId(this);
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,GeneratorGlobOptPhase,uVar2,uVar3);
        local_21 = bVar1 ^ 0xff;
      }
      local_11 = local_21;
    }
  }
LAB_004e904d:
  return (bool)(local_11 & 1);
}

Assistant:

bool DoGlobOpt() const
    {
        return
            !PHASE_OFF(Js::GlobOptPhase, this) && !IsSimpleJit() &&
            (!GetTopFunc()->HasTry() || GetTopFunc()->CanOptimizeTryCatch()) &&
            (!GetTopFunc()->HasFinally() || GetTopFunc()->CanOptimizeTryFinally()) &&
            (!GetTopFunc()->GetJITFunctionBody()->IsCoroutine() || !PHASE_OFF(Js::GeneratorGlobOptPhase, this));
    }